

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O2

void __thiscall
amrex::EB2::
GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>_>
::define_fine(GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>_>
              *this,GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
                    *gshop,Geometry *geom,int max_grid_size,int ngrow,bool extend_domain_face,
             int num_crse_opt)

{
  Box *pBVar1;
  BoxArray *this_00;
  DistributionMapping *this_01;
  FabArray<amrex::EBCellFlagFab> *this_02;
  MultiFab *this_03;
  MultiFab *this_04;
  MultiFab *this_05;
  MultiFab *this_06;
  MultiFab *this_07;
  pointer pBVar2;
  pointer pBVar3;
  GFab *this_08;
  undefined8 uVar4;
  pointer pGVar5;
  undefined8 uVar6;
  ulong uVar7;
  Level *pLVar8;
  Level *pLVar9;
  Level *pLVar10;
  Level *pLVar11;
  GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>_>
  *pGVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  int i;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ostream *poVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int *piVar24;
  undefined4 uVar25;
  Box *pBVar26;
  long *plVar27;
  uint uVar28;
  undefined7 in_register_00000089;
  Long i_1;
  double dVar29;
  initializer_list<std::reference_wrapper<int>_> __l;
  Periodicity PVar30;
  bool cover_multiple_cuts;
  int nmulticuts;
  int nsmallcells;
  Geometry *local_ed0;
  GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>_>
  *local_ec8;
  undefined4 local_ebc;
  int nmc;
  int maxiter;
  FabArray<amrex::FArrayBox> *local_eb0;
  int nsm;
  FabArrayBase *local_ea0;
  FabArray<amrex::FArrayBox> *local_e98;
  GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
  *local_e90;
  Box lhs;
  int local_e68 [2];
  int local_e60;
  Vector<int,_std::allocator<int>_> *local_e48;
  IntVect crse_ratio;
  undefined4 uStack_e1c;
  BoxList cut_boxes;
  Box result;
  _Rb_tree_node_base local_d68;
  size_t local_d48;
  BoxList covered_boxes;
  Box bounding_box;
  uint local_cf8;
  uint uStack_cf4;
  Real small_volfrac;
  Array4<double> local_cc8;
  undefined8 local_c88;
  undefined8 uStack_c80;
  Array4<const_unsigned_int> local_c70;
  Array4<const_unsigned_int> local_c30;
  Array4<const_unsigned_int> local_bf0;
  MFInfo mf_info;
  Array4<amrex::EBCellFlag> local_b38;
  Box bx;
  undefined4 uStack_adc;
  Array4<double> local_a30;
  ParmParse pp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  int local_990;
  int local_98c;
  int local_988;
  int local_984;
  int local_980;
  int local_97c;
  double *local_950;
  float local_948;
  Box local_944 [7];
  Array4<double> local_868;
  Array4<double> local_828;
  Array4<double> local_7e8;
  Array4<amrex::EBCellFlag> local_7a8;
  Box domain_grown;
  Array4<const_double> local_748;
  Array4<const_double> local_708;
  Array4<unsigned_int> local_6c8;
  Array4<unsigned_int> local_688;
  Array4<unsigned_int> local_648;
  GpuArray<double,_3U> local_608;
  GpuArray<double,_3U> local_5e8;
  BoxList test_boxes;
  Box local_448;
  Array4<double> local_420;
  Array4<double> local_3e0;
  Array4<double> local_3a0;
  Array4<const_double> local_360;
  Array4<const_double> local_320;
  Array4<const_double> local_2e0;
  Array4<const_double> local_2a0;
  Array4<double> local_260;
  Array4<double> local_220;
  Array4<double> local_1e0;
  _Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_> local_1a0
  ;
  Elixir cellflagtmp_eli;
  Array4<double> local_170;
  Array4<double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  local_eb0 = (FabArray<amrex::FArrayBox> *)CONCAT44(local_eb0._4_4_,max_grid_size);
  local_ed0 = geom;
  local_e90 = gshop;
  iVar16 = Verbose();
  local_ebc = (undefined4)CONCAT71(in_register_00000089,extend_domain_face);
  if (0 < iVar16 && !extend_domain_face) {
    poVar20 = OutStream();
    Print::Print((Print *)&pp,poVar20);
    std::operator<<((ostream *)
                    &pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start,
                    "AMReX WARNING: extend_domain_face=false is not recommended!\n");
    Print::~Print((Print *)&pp);
  }
  small_volfrac = 1e-14;
  cover_multiple_cuts = false;
  maxiter = 0x20;
  std::__cxx11::string::string((string *)&test_boxes,"eb2",(allocator *)&bx);
  ParmParse::ParmParse(&pp,(string *)&test_boxes);
  std::__cxx11::string::~string((string *)&test_boxes);
  ParmParse::queryAdd<double,_0>(&pp,"small_volfrac",&small_volfrac);
  ParmParse::queryAdd<bool,_0>(&pp,"cover_multiple_cuts",&cover_multiple_cuts);
  ParmParse::queryAdd<int,_0>(&pp,"maxiter",&maxiter);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  dVar29 = ceil((double)ngrow * 0.0625);
  iVar16 = (int)dVar29 << 4;
  (this->super_Level).m_ngrow.vect[0] = iVar16;
  (this->super_Level).m_ngrow.vect[1] = iVar16;
  (this->super_Level).m_ngrow.vect[2] = iVar16;
  pBVar1 = &local_ed0->domain;
  uVar6 = *(undefined8 *)((local_ed0->domain).smallend.vect + 2);
  domain_grown.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_ed0->domain).bigend.vect >> 0x20)
  ;
  domain_grown._20_8_ = *(undefined8 *)((local_ed0->domain).bigend.vect + 2);
  domain_grown.smallend.vect._0_8_ = *(undefined8 *)(local_ed0->domain).smallend.vect;
  domain_grown.smallend.vect[2] = (int)uVar6;
  domain_grown.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
  for (lVar21 = 0x32; lVar21 != 0x35; lVar21 = lVar21 + 1) {
    iVar16 = 0;
    if (*(char *)((long)(local_ed0->super_CoordSys).offset + lVar21 + 0x17) == '\0') {
      iVar16 = (*(int *)((long)&local_828.p + lVar21 * 4 + 4) - (&local_868.ncomp)[lVar21]) + 1;
      iVar19 = *(int *)((long)(this->super_Level).m_geom.super_CoordSys.offset + lVar21 * 4 + -8);
      if (iVar19 <= iVar16) {
        iVar16 = iVar19;
      }
    }
    *(int *)((long)(this->super_Level).m_geom.super_CoordSys.offset + lVar21 * 4 + -8) = iVar16;
  }
  Box::grow(&domain_grown,&(this->super_Level).m_ngrow);
  pBVar26 = &domain_grown;
  if ((char)local_ebc != '\0') {
    pBVar26 = pBVar1;
  }
  uVar6 = *(undefined8 *)((pBVar26->smallend).vect + 2);
  bounding_box.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar26->bigend).vect >> 0x20);
  bounding_box._20_8_ = *(undefined8 *)((pBVar26->bigend).vect + 2);
  bounding_box.smallend.vect._0_8_ = *(undefined8 *)(pBVar26->smallend).vect;
  bounding_box.smallend.vect[2] = (int)uVar6;
  bounding_box.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
  for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
    if ((bounding_box.btype.itype >> ((uint)lVar21 & 0x1f) & 1) == 0) {
      piVar24 = bounding_box.bigend.vect + lVar21;
      *piVar24 = *piVar24 + 1;
    }
  }
  bounding_box.btype.itype = 7;
  BoxList::BoxList(&cut_boxes);
  BoxList::BoxList(&covered_boxes);
  iVar16 = *(int *)(ParallelContext::frames + 0x10);
  iVar19 = *(int *)(ParallelContext::frames + 0xc);
  iVar18 = 8;
  if (num_crse_opt < 8) {
    iVar18 = num_crse_opt;
  }
  local_ec8 = this;
  if (iVar18 < 1) {
    iVar18 = 0;
  }
  for (; -1 < iVar18; iVar18 = iVar18 + -1) {
    crse_ratio.vect[1] = 1 << ((byte)iVar18 & 0x1f);
    crse_ratio.vect[0] = crse_ratio.vect[1];
    stack0xfffffffffffff1e0 = CONCAT44(uStack_e1c,crse_ratio.vect[1]);
    bVar15 = Box::coarsenable(pBVar1,&crse_ratio,1);
    if (bVar15) {
      result.bigend.vect[1] = bounding_box.bigend.vect[1];
      result.bigend.vect[2] = bounding_box.bigend.vect[2];
      result.btype.itype = bounding_box.btype.itype;
      result.smallend.vect[0] = bounding_box.smallend.vect[0];
      result.smallend.vect[1] = bounding_box.smallend.vect[1];
      uVar6 = result.smallend.vect._0_8_;
      result.smallend.vect[2] = bounding_box.smallend.vect[2];
      result.bigend.vect[0] = bounding_box.bigend.vect[0];
      result.smallend.vect[1] = bounding_box.smallend.vect[1];
      uVar17 = result.smallend.vect[1];
      uVar28 = result.bigend.vect[2];
      if (crse_ratio.vect[1] == 1 && crse_ratio.vect[0] == 1) {
        result.smallend.vect._0_8_ = uVar6;
        if (crse_ratio.vect[2] != 1) goto LAB_00213bdd;
      }
      else {
        result.smallend.vect[0] = bounding_box.smallend.vect[0];
        if (crse_ratio.vect[0] != 1) {
          if (crse_ratio.vect[0] == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (crse_ratio.vect[0] == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / crse_ratio.vect[0]);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / crse_ratio.vect[0];
          }
        }
        if (crse_ratio.vect[1] != 1) {
          if (crse_ratio.vect[1] == 4) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar17 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar17 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (crse_ratio.vect[1] == 2) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar17 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar17 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if ((long)bounding_box.smallend.vect._0_8_ < 0) {
            uVar17 = ~(~result.smallend.vect[1] / crse_ratio.vect[1]);
          }
          else {
            uVar17 = result.smallend.vect[1] / crse_ratio.vect[1];
          }
        }
LAB_00213bdd:
        result.smallend.vect[1] = uVar17;
        if (crse_ratio.vect[2] != 1) {
          if (crse_ratio.vect[2] == 4) {
            if (bounding_box.smallend.vect[2] < 0) {
              result.smallend.vect[2] = bounding_box.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 2;
            }
          }
          else if (crse_ratio.vect[2] == 2) {
            if (bounding_box.smallend.vect[2] < 0) {
              result.smallend.vect[2] = bounding_box.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 1;
            }
          }
          else if (bounding_box.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~bounding_box.smallend.vect[2] / crse_ratio.vect[2]);
          }
          else {
            result.smallend.vect[2] = bounding_box.smallend.vect[2] / crse_ratio.vect[2];
          }
        }
        if (result.btype.itype == 0) {
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 2;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 1;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              result.bigend.vect[0] = ~(~bounding_box.bigend.vect[0] / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 2;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 1;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              result.bigend.vect[1] = ~(~bounding_box.bigend.vect[1] / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              uVar28 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              uVar28 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar28 = ~(~result.bigend.vect[2] / crse_ratio.vect[2]);
            }
            else {
              uVar28 = result.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
        }
        else {
          pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0;
          pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
          pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = 0;
          for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
            if (((result.btype.itype >> ((uint)lVar21 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar21] % crse_ratio.vect[lVar21] != 0)) {
              *(undefined4 *)
               ((long)&pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar21 * 4) = 1;
            }
          }
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 2;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 1;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              result.bigend.vect[0] = ~(~bounding_box.bigend.vect[0] / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 2;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 1;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              result.bigend.vect[1] = ~(~bounding_box.bigend.vect[1] / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          uVar17 = result.bigend.vect[2];
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              uVar17 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar17 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              uVar17 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar17 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar17 = ~(~result.bigend.vect[2] / crse_ratio.vect[2]);
            }
            else {
              uVar17 = result.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
          result.bigend.vect[0] =
               result.bigend.vect[0] +
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map;
          result.bigend.vect[1] =
               result.bigend.vect[1] +
               pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map._4_4_;
          uVar28 = uVar17 + (int)pp.m_pstack.c.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map_size;
        }
      }
      result.bigend.vect[2] = uVar28;
      memcpy((Geometry *)&pp,local_ed0,200);
      Geometry::coarsen((Geometry *)&pp,&crse_ratio);
      BoxList::BoxList(&test_boxes);
      if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start ==
          cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        BoxList::clear(&covered_boxes);
        BoxList::BoxList((BoxList *)&bx,local_944);
        BoxList::operator=(&test_boxes,(BoxList *)&bx);
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bx);
      }
      else {
        BoxList::swap(&test_boxes,&cut_boxes);
        BoxList::coarsen(&test_boxes,&crse_ratio);
      }
      BoxList::maxSize(&test_boxes,(int)local_eb0);
      iVar14 = result.bigend.vect[2];
      iVar13 = result.smallend.vect[2];
      uVar6 = result.smallend.vect._0_8_;
      local_e98 = (FabArray<amrex::FArrayBox> *)CONCAT44(local_e98._4_4_,iVar18);
      lVar22 = (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_c88 = (FabArray<amrex::FArrayBox> *)
                  CONCAT44(result.bigend.vect[1],result.bigend.vect[0]);
      uStack_c80 = 0;
      for (lVar21 = (long)iVar19; lVar21 < lVar22 / 0x1c; lVar21 = lVar21 + iVar16) {
        pBVar2 = test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar21;
        uVar17 = test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21].btype.itype;
        pBVar3 = test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar21;
        bx.smallend.vect[0] = (pBVar3->smallend).vect[0] - 1;
        bx.smallend.vect[1] = (pBVar3->smallend).vect[1] - 1;
        bx.smallend.vect[2] = (pBVar3->smallend).vect[2] + -1;
        bx.bigend.vect[0] = (pBVar3->bigend).vect[0] + 1;
        uVar4 = *(undefined8 *)
                 (test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar21].bigend.vect + 1);
        bx.bigend.vect[1] = (int)uVar4 + 1;
        bx.bigend.vect[2] = (int)((ulong)uVar4 >> 0x20) + 1;
        bx.btype.itype = uVar17;
        for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
          if ((uVar17 >> ((uint)lVar23 & 0x1f) & 1) == 0) {
            piVar24 = bx.bigend.vect + lVar23;
            *piVar24 = *piVar24 + 1;
          }
        }
        stack0xfffffffffffff520 = CONCAT44(uStack_adc,7);
        local_cf8 = (uint)uVar6;
        uStack_cf4 = SUB84(uVar6,4);
        lhs.smallend.vect[1] =
             ~-(uint)((int)uStack_cf4 < bx.smallend.vect[1]) & uStack_cf4 |
             bx.smallend.vect[1] & -(uint)((int)uStack_cf4 < bx.smallend.vect[1]);
        lhs.smallend.vect[0] =
             ~-(uint)((int)local_cf8 < bx.smallend.vect[0]) & local_cf8 |
             bx.smallend.vect[0] & -(uint)((int)local_cf8 < bx.smallend.vect[0]);
        lhs.smallend.vect[2] = bx.smallend.vect[2];
        if (bx.smallend.vect[2] <= iVar13) {
          lhs.smallend.vect[2] = iVar13;
        }
        lhs.bigend.vect[0] =
             ~-(uint)(bx.bigend.vect[0] < (int)(uint)local_c88) & (uint)local_c88 |
             bx.bigend.vect[0] & -(uint)(bx.bigend.vect[0] < (int)(uint)local_c88);
        lhs.bigend.vect[1] =
             ~-(uint)(bx.bigend.vect[1] < (int)local_c88._4_4_) & local_c88._4_4_ |
             bx.bigend.vect[1] & -(uint)(bx.bigend.vect[1] < (int)local_c88._4_4_);
        lhs.bigend.vect[2] = bx.bigend.vect[2];
        if (iVar14 <= bx.bigend.vect[2]) {
          lhs.bigend.vect[2] = iVar14;
        }
        lhs.btype.itype = 7;
        iVar18 = GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
                 ::getBoxType_Cpu(local_e90,&lhs,(Geometry *)&pp);
        if (iVar18 == 0) {
          lhs.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
          uVar4 = *(undefined8 *)((pBVar2->smallend).vect + 2);
          uVar7 = *(ulong *)((pBVar2->bigend).vect + 2);
          lhs.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar2->bigend).vect >> 0x20);
          lhs.smallend.vect[2] = (int)uVar4;
          lhs.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
          lhs._20_8_ = uVar7;
          if (crse_ratio.vect[2] != 1 || (crse_ratio.vect[1] != 1 || crse_ratio.vect[0] != 1)) {
            lhs.btype.itype = (uint)(uVar7 >> 0x20);
            uVar17 = (uint)((uVar7 & 0x200000000) == 0);
            lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
            lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
            lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
            lhs.bigend.vect[2] = (int)uVar7;
            uVar28 = (uint)((uVar7 & 0x400000000) == 0);
            lhs.bigend.vect[0] =
                 (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                 (~lhs.btype.itype & 1);
            lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar17) * crse_ratio.vect[1] - uVar17;
            lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar28) * crse_ratio.vect[2] - uVar28;
          }
          std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&cut_boxes,&lhs);
        }
        else if (iVar18 == 1) {
          lhs.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
          uVar4 = *(undefined8 *)((pBVar2->smallend).vect + 2);
          uVar7 = *(ulong *)((pBVar2->bigend).vect + 2);
          lhs.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar2->bigend).vect >> 0x20);
          lhs.smallend.vect[2] = (int)uVar4;
          lhs.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
          lhs._20_8_ = uVar7;
          if (crse_ratio.vect[2] != 1 || (crse_ratio.vect[1] != 1 || crse_ratio.vect[0] != 1)) {
            lhs.btype.itype = (uint)(uVar7 >> 0x20);
            uVar17 = (uint)((uVar7 & 0x200000000) == 0);
            lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
            lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
            lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
            lhs.bigend.vect[2] = (int)uVar7;
            uVar28 = (uint)((uVar7 & 0x400000000) == 0);
            lhs.bigend.vect[0] =
                 (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                 (~lhs.btype.itype & 1);
            lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar17) * crse_ratio.vect[1] - uVar17;
            lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar28) * crse_ratio.vect[2] - uVar28;
          }
          std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&covered_boxes,&lhs);
        }
      }
      AllGatherBoxes(&cut_boxes.m_lbox,0);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&test_boxes);
      this = local_ec8;
      iVar18 = (int)local_e98;
    }
  }
  AllGatherBoxes(&covered_boxes.m_lbox,0);
  if ((((this->super_Level).m_ngrow.vect[0] != 0) || ((this->super_Level).m_ngrow.vect[1] != 0)) ||
     ((this->super_Level).m_ngrow.vect[2] != 0)) {
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = (int)this;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._4_4_ = (undefined4)((ulong)this >> 0x20);
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pBVar1;
    define_fine::anon_class_16_2_8819bab3::operator()
              ((anon_class_16_2_8819bab3 *)&pp,&covered_boxes);
    define_fine::anon_class_16_2_8819bab3::operator()((anon_class_16_2_8819bab3 *)&pp,&cut_boxes);
  }
  if ((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish) &&
     (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    Abort_host("AMReX_EB2_Level.H: Domain is completely covered");
  }
  if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (2 < num_crse_opt) {
      BoxList::maxSize(&covered_boxes,(int)local_eb0 << 2);
    }
    BoxArray::BoxArray((BoxArray *)&pp,&covered_boxes);
    BoxArray::operator=(&(this->super_Level).m_covered_grids,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
  }
  if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    BoxArray::BoxArray((BoxArray *)&pp);
    BoxArray::operator=(&(this->super_Level).m_grids,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping((DistributionMapping *)&pp);
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_Level).m_dmap,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&pp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &pp.m_pstack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size);
    (this->super_Level).m_allregular = true;
    (this->super_Level).m_ok = true;
  }
  else {
    BoxArray::BoxArray((BoxArray *)&pp,&cut_boxes);
    this_00 = &(this->super_Level).m_grids;
    BoxArray::operator=(this_00,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)&pp,this_00,*(int *)(ParallelContext::frames + 0x10));
    this_01 = &(this->super_Level).m_dmap;
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)this_01,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&pp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &pp.m_pstack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size);
    local_ea0 = (FabArrayBase *)&(this->super_Level).m_mgf;
    MultiGFab::define((MultiGFab *)local_ea0,this_00,this_01);
    mf_info.alloc = true;
    mf_info.arena = (Arena *)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFInfo::SetTag(&mf_info,"EB2::Level");
    this_02 = &(this->super_Level).m_cellflag;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d9098;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    FabArray<amrex::EBCellFlagFab>::define
              (this_02,this_00,this_01,1,2,&mf_info,(FabFactory<amrex::EBCellFlagFab> *)&pp);
    this_03 = &(this->super_Level).m_volfrac;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d8928;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    MultiFab::define(this_03,this_00,this_01,1,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_04 = &(this->super_Level).m_centroid;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d8928;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    MultiFab::define(this_04,this_00,this_01,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_05 = &(this->super_Level).m_bndryarea;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d8928;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    MultiFab::define(this_05,this_00,this_01,1,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_06 = &(this->super_Level).m_bndrycent;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d8928;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    MultiFab::define(this_06,this_00,this_01,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_07 = &(this->super_Level).m_bndrynorm;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = 0x6d8928;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = 0;
    MultiFab::define(this_07,this_00,this_01,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    local_c88 = (FabArray<amrex::FArrayBox> *)&(this->super_Level).m_edgecent;
    lVar21 = 0;
    lVar22 = 0;
    while( true ) {
      if (lVar21 == 0x480) break;
      iVar16 = (int)lVar22;
      if (iVar16 == 1) {
        uVar25 = 0;
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x100000000;
      }
      else if (iVar16 == 0) {
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x1;
        uVar25 = 0;
      }
      else {
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        uVar25 = 1;
      }
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(test_boxes.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,uVar25);
      convert((BoxArray *)&pp,this_00,(IntVect *)&test_boxes);
      plVar27 = (long *)((long)&(local_ec8->super_Level).m_areafrac._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar21);
      bx.smallend.vect._0_8_ = &PTR__FabFactory_006d8928;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,this_01,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      if (iVar16 == 1) {
        uVar25 = 0;
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x100000000;
      }
      else if (iVar16 == 0) {
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x1;
        uVar25 = 0;
      }
      else {
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        uVar25 = 1;
      }
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(test_boxes.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,uVar25);
      convert((BoxArray *)&pp,this_00,(IntVect *)&test_boxes);
      plVar27 = (long *)((long)&(local_ec8->super_Level).m_facecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar21);
      bx.smallend.vect._0_8_ = &PTR__FabFactory_006d8928;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,this_01,2,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x100000001;
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(test_boxes.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,1);
      *(undefined4 *)
       ((long)&test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start + lVar22 * 4) = 0;
      convert((BoxArray *)&pp,this_00,(IntVect *)&test_boxes);
      plVar27 = (long *)((long)&(local_ec8->super_Level).m_edgecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar21);
      bx.smallend.vect._0_8_ = &PTR__FabFactory_006d8928;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,this_01,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x180;
    }
    local_5e8.arr[0] = (local_ed0->super_CoordSys).dx[0];
    local_5e8.arr[1] = (local_ed0->super_CoordSys).dx[1];
    local_5e8.arr[2] = (local_ed0->super_CoordSys).dx[2];
    local_608.arr[0] = (local_ed0->prob_domain).xlo[0];
    local_608.arr[1] = (local_ed0->prob_domain).xlo[1];
    local_608.arr[2] = (local_ed0->prob_domain).xlo[2];
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      if (((char)local_ebc == '\0') ||
         (*(char *)((long)(local_ed0->super_CoordSys).inv_dx + lVar21 + 0x19) == '\x01')) {
        piVar24 = bounding_box.smallend.vect + lVar21;
        *piVar24 = *piVar24 + -2;
        piVar24 = bounding_box.bigend.vect + lVar21;
        *piVar24 = *piVar24 + 2;
      }
    }
    pLVar8 = &local_ec8->super_Level;
    pLVar9 = &local_ec8->super_Level;
    pLVar10 = &local_ec8->super_Level;
    pLVar11 = &local_ec8->super_Level;
    local_e98 = &(local_ec8->super_Level).m_edgecent._M_elems[1].super_FabArray<amrex::FArrayBox>;
    local_eb0 = &(local_ec8->super_Level).m_edgecent._M_elems[2].super_FabArray<amrex::FArrayBox>;
    iVar16 = 0;
    while( true ) {
      if (maxiter <= iVar16) break;
      nsmallcells = 0;
      nmulticuts = 0;
      std::array<amrex::BaseFab<double>,_3UL>::array((array<amrex::BaseFab<double>,_3UL> *)&pp);
      result.smallend.vect[2] = 0;
      result.bigend.vect[0] = 0;
      result.bigend.vect[1] = 0;
      result.bigend.vect[2] = 0;
      result.btype.itype = 1;
      result.smallend.vect._0_8_ = &PTR__EBCellFlagFab_006d9100;
      local_d68._M_color = _S_red;
      local_d68._M_parent = (_Base_ptr)0x0;
      local_d68._M_left = &local_d68;
      local_d48 = 0;
      local_d68._M_right = local_d68._M_left;
      MFIter::MFIter((MFIter *)&lhs,local_ea0,'\0');
      while (local_e68[0] < local_e60) {
        iVar19 = local_e68[0];
        if (local_e48 != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar19 = (local_e48->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_e68[0]];
        }
        pGVar5 = (local_ec8->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
                 super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
                 super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
                 super__Vector_impl_data._M_start;
        this_08 = pGVar5 + iVar19;
        uVar6 = *(undefined8 *)((long)&pGVar5[iVar19].m_validbox.smallend + 8);
        local_448.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)pGVar5[iVar19].m_validbox.bigend.vect >> 0x20);
        local_448._20_8_ = *(undefined8 *)((long)&pGVar5[iVar19].m_validbox.bigend + 8);
        local_448.smallend.vect._0_8_ = *(undefined8 *)&pGVar5[iVar19].m_validbox.smallend;
        local_448.smallend.vect[2] = (int)uVar6;
        local_448.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
        if (iVar16 == 0) {
          GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
          ::
          fillFab<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_nullptr>
                    (local_e90,&this_08->m_levelset,local_ed0,Cpu,&bounding_box);
        }
        piVar24 = local_e68;
        if (local_e48 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar24 = (local_e48->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_e68[0];
        }
        GFab::buildTypes(this_08,(local_ec8->super_Level).m_cellflag.m_fabs_v.
                                 super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[*piVar24]);
        crse_ratio.vect._0_8_ = (this_08->m_levelset).dptr;
        register0x00000080 =
             ((long)(this_08->m_levelset).domain.bigend.vect[0] -
             (long)(this_08->m_levelset).domain.smallend.vect[0]) + 1;
        local_cc8.p = (this_08->m_levelset).dptr;
        local_cc8.ncomp = (this_08->m_levelset).nvar;
        pBVar1 = &(this_08->m_levelset).domain;
        local_cc8.begin.z = (this_08->m_levelset).domain.smallend.vect[2];
        local_cc8.begin.x = (pBVar1->smallend).vect[0];
        local_cc8.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_levelset).domain.bigend.vect[1] + 1;
        lVar22 = (long)(this_08->m_levelset).domain.bigend.vect[0];
        lVar23 = (long)(this_08->m_levelset).domain.bigend.vect[2] + 1;
        local_cc8.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
        local_cc8.kstride =
             (lVar21 - (this_08->m_levelset).domain.smallend.vect[1]) * local_cc8.jstride;
        local_cc8.nstride = (lVar23 - local_cc8.begin.z) * local_cc8.kstride;
        local_cc8.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
        local_cc8.end.z = (int)lVar23;
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_7a8,this_02,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,&this_03->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_b0,&this_04->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_f0,&this_05->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_130,&this_06->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_170,&this_07->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1e0,(FabArray<amrex::FArrayBox> *)&(this->super_Level).m_areafrac,
                   (MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_220,&(pLVar8->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_260,&(pLVar9->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3a0,(FabArray<amrex::FArrayBox> *)&(this->super_Level).m_facecent,
                   (MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3e0,&(pLVar10->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_420,&(pLVar11->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&lhs);
        local_648.p = (this_08->m_facetype)._M_elems[0].dptr;
        local_648.ncomp = (this_08->m_facetype)._M_elems[0].nvar;
        pBVar1 = &(this_08->m_facetype)._M_elems[0].domain;
        local_648.begin.z = (this_08->m_facetype)._M_elems[0].domain.smallend.vect[2];
        local_648.begin.x = (pBVar1->smallend).vect[0];
        local_648.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_facetype)._M_elems[0].domain.bigend.vect[1] + 1;
        lVar22 = (long)(this_08->m_facetype)._M_elems[0].domain.bigend.vect[0];
        lVar23 = (long)(this_08->m_facetype)._M_elems[0].domain.bigend.vect[2] + 1;
        local_648.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
        local_648.kstride =
             (lVar21 - (this_08->m_facetype)._M_elems[0].domain.smallend.vect[1]) *
             local_648.jstride;
        local_648.nstride = (lVar23 - local_648.begin.z) * local_648.kstride;
        local_648.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
        local_648.end.z = (int)lVar23;
        local_688.p = (this_08->m_facetype)._M_elems[1].dptr;
        local_688.ncomp = (this_08->m_facetype)._M_elems[1].nvar;
        pBVar1 = &(this_08->m_facetype)._M_elems[1].domain;
        local_688.begin.z = (this_08->m_facetype)._M_elems[1].domain.smallend.vect[2];
        local_688.begin.x = (pBVar1->smallend).vect[0];
        local_688.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_facetype)._M_elems[1].domain.bigend.vect[1] + 1;
        lVar22 = (long)(this_08->m_facetype)._M_elems[1].domain.bigend.vect[0];
        lVar23 = (long)(this_08->m_facetype)._M_elems[1].domain.bigend.vect[2] + 1;
        local_688.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
        local_688.kstride =
             (lVar21 - (this_08->m_facetype)._M_elems[1].domain.smallend.vect[1]) *
             local_688.jstride;
        local_688.nstride = (lVar23 - local_688.begin.z) * local_688.kstride;
        local_688.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
        local_688.end.z = (int)lVar23;
        local_6c8.p = (this_08->m_facetype)._M_elems[2].dptr;
        local_6c8.ncomp = (this_08->m_facetype)._M_elems[2].nvar;
        pBVar1 = &(this_08->m_facetype)._M_elems[2].domain;
        local_6c8.begin.z = (this_08->m_facetype)._M_elems[2].domain.smallend.vect[2];
        local_6c8.begin.x = (pBVar1->smallend).vect[0];
        local_6c8.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_facetype)._M_elems[2].domain.bigend.vect[1] + 1;
        lVar22 = (long)(this_08->m_facetype)._M_elems[2].domain.bigend.vect[0];
        lVar23 = (long)(this_08->m_facetype)._M_elems[2].domain.bigend.vect[2] + 1;
        local_6c8.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
        local_6c8.kstride =
             (lVar21 - (this_08->m_facetype)._M_elems[2].domain.smallend.vect[1]) *
             local_6c8.jstride;
        local_6c8.nstride = (lVar23 - local_6c8.begin.z) * local_6c8.kstride;
        local_6c8.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
        local_6c8.end.z = (int)lVar23;
        nmc = 0;
        nsm = 0;
        local_bf0.p = (this_08->m_edgetype)._M_elems[0].dptr;
        local_bf0.ncomp = (this_08->m_edgetype)._M_elems[0].nvar;
        pBVar1 = &(this_08->m_edgetype)._M_elems[0].domain;
        local_bf0.begin.z = (this_08->m_edgetype)._M_elems[0].domain.smallend.vect[2];
        local_bf0.begin.x = (pBVar1->smallend).vect[0];
        local_bf0.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_edgetype)._M_elems[0].domain.bigend.vect[1] + 1;
        local_bf0.end.x = (this_08->m_edgetype)._M_elems[0].domain.bigend.vect[0];
        lVar22 = (long)(this_08->m_edgetype)._M_elems[0].domain.bigend.vect[2] + 1;
        local_bf0.jstride = ((long)local_bf0.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
        local_bf0.end.x = local_bf0.end.x + 1;
        local_bf0.kstride =
             (lVar21 - (this_08->m_edgetype)._M_elems[0].domain.smallend.vect[1]) *
             local_bf0.jstride;
        local_bf0.nstride = (lVar22 - local_bf0.begin.z) * local_bf0.kstride;
        local_bf0.end.y = (int)lVar21;
        local_bf0.end.z = (int)lVar22;
        local_c30.p = (this_08->m_edgetype)._M_elems[1].dptr;
        local_c30.ncomp = (this_08->m_edgetype)._M_elems[1].nvar;
        pBVar1 = &(this_08->m_edgetype)._M_elems[1].domain;
        local_c30.begin.z = (this_08->m_edgetype)._M_elems[1].domain.smallend.vect[2];
        local_c30.begin.x = (pBVar1->smallend).vect[0];
        local_c30.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_edgetype)._M_elems[1].domain.bigend.vect[1] + 1;
        local_c30.end.x = (this_08->m_edgetype)._M_elems[1].domain.bigend.vect[0];
        lVar22 = (long)(this_08->m_edgetype)._M_elems[1].domain.bigend.vect[2] + 1;
        local_c30.jstride = ((long)local_c30.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
        local_c30.end.x = local_c30.end.x + 1;
        local_c30.kstride =
             (lVar21 - (this_08->m_edgetype)._M_elems[1].domain.smallend.vect[1]) *
             local_c30.jstride;
        local_c30.nstride = (lVar22 - local_c30.begin.z) * local_c30.kstride;
        local_c30.end.y = (int)lVar21;
        local_c30.end.z = (int)lVar22;
        local_c70.p = (this_08->m_edgetype)._M_elems[2].dptr;
        local_c70.ncomp = (this_08->m_edgetype)._M_elems[2].nvar;
        pBVar1 = &(this_08->m_edgetype)._M_elems[2].domain;
        local_c70.begin.z = (this_08->m_edgetype)._M_elems[2].domain.smallend.vect[2];
        local_c70.begin.x = (pBVar1->smallend).vect[0];
        local_c70.begin.y = (pBVar1->smallend).vect[1];
        lVar21 = (long)(this_08->m_edgetype)._M_elems[2].domain.bigend.vect[1] + 1;
        lVar22 = (long)(this_08->m_edgetype)._M_elems[2].domain.bigend.vect[0];
        lVar23 = (long)(this_08->m_edgetype)._M_elems[2].domain.bigend.vect[2] + 1;
        local_c70.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
        local_c70.kstride =
             (lVar21 - (this_08->m_edgetype)._M_elems[2].domain.smallend.vect[1]) *
             local_c70.jstride;
        local_c70.nstride = (lVar23 - local_c70.begin.z) * local_c70.kstride;
        local_c70.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
        local_c70.end.z = (int)lVar23;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_7e8,local_c88,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_828,local_e98,(MFIter *)&lhs);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_868,local_eb0,(MFIter *)&lhs);
        bx.bigend.vect[1] = (int)local_bf0.kstride;
        bx.bigend.vect[2] = (int)((ulong)local_bf0.kstride >> 0x20);
        bx.smallend.vect[2] = (int)local_bf0.jstride;
        bx.bigend.vect[0] = (int)((ulong)local_bf0.jstride >> 0x20);
        if (iVar16 == 0) {
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_7e8.kstride;
          test_boxes._24_8_ = local_7e8.nstride;
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_7e8.p;
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_7e8.jstride;
          stack0xfffffffffffff520 = local_bf0.nstride;
          bx.smallend.vect._0_8_ = local_bf0.p;
          GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
          ::
          getIntercept<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_nullptr>
                    (local_e90,(Array<Array4<Real>,_3> *)&test_boxes,
                     (Array<Array4<const_Type_t>,_3> *)&bx,(Array4<const_double> *)&crse_ratio,
                     local_ed0,Cpu,&bounding_box);
        }
        else {
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_7e8.kstride;
          test_boxes._24_8_ = local_7e8.nstride;
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_7e8.p;
          test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_7e8.jstride;
          stack0xfffffffffffff520 = local_bf0.nstride;
          bx.smallend.vect._0_8_ = local_bf0.p;
          GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
          ::updateIntercept(local_e90,(Array<Array4<Real>,_3> *)&test_boxes,
                            (Array<Array4<const_Type_t>,_3> *)&bx,
                            (Array4<const_double> *)&crse_ratio,local_ed0);
        }
        for (lVar21 = 0;
            iVar13 = pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
            iVar18 = (int)pp.m_pstack.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last, lVar21 != 0xd8;
            lVar21 = lVar21 + 0x48) {
          BaseFab<double>::resize
                    ((BaseFab<double> *)
                     ((long)&pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map + lVar21),
                     (Box *)((long)pGVar5[iVar19].m_facetype._M_elems + lVar21 + 0x18),3,
                     (Arena *)0x0);
        }
        lVar22 = (long)pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
        lVar23 = (long)(int)pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node;
        lVar21 = (long)pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_;
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur;
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((lVar22 - (int)pp.m_pstack.c.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_first) + 1)
        ;
        test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(((lVar23 + 1) -
                       (long)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_) *
                      (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish);
        test_boxes._24_8_ =
             ((lVar21 + 1) -
             (long)(int)pp.m_pstack.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last) *
             (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        bx.smallend.vect._0_8_ = local_998._M_pi;
        bx._8_8_ = ((long)local_984 - (long)local_990) + 1;
        bx.bigend.vect._4_8_ = (((long)local_980 + 1) - (long)local_98c) * bx._8_8_;
        register0x00000088 = (((long)local_97c + 1) - (long)local_988) * bx.bigend.vect._4_8_;
        local_a30.begin.y = local_944[0].smallend.vect[0];
        local_a30.begin.x = (int)local_948;
        local_a30.p = local_950;
        local_a30.jstride = ((long)local_944[0].smallend.vect[2] - (long)(int)local_948) + 1;
        local_a30.kstride =
             (((long)local_944[0].bigend.vect[0] + 1) - (long)local_944[0].smallend.vect[0]) *
             local_a30.jstride;
        local_a30.nstride =
             (((long)local_944[0].bigend.vect[1] + 1) - (long)local_944[0].smallend.vect[1]) *
             local_a30.kstride;
        local_a30.begin.z = local_944[0].smallend.vect[1];
        local_a30.end._0_8_ =
             (long)local_944[0].smallend.vect[2] + 1U & 0xffffffff |
             (long)local_944[0].bigend.vect[0] + 1 << 0x20;
        local_a30.end.z = (int)((long)local_944[0].bigend.vect[1] + 1);
        local_a30.ncomp = local_944[0].btype.itype;
        local_b38.p = (EBCellFlag *)local_7e8.p;
        local_b38.jstride = local_7e8.jstride;
        local_b38.kstride = local_7e8.kstride;
        local_b38.nstride = local_7e8.nstride;
        local_b38.begin.z = local_7e8.begin.z;
        local_b38.begin.x = local_7e8.begin.x;
        local_b38.begin.y = local_7e8.begin.y;
        local_b38.end.z = local_7e8.end.z;
        local_b38.ncomp = local_7e8.ncomp;
        local_708.p = local_828.p;
        local_708.jstride = local_828.jstride;
        local_708.kstride = local_828.kstride;
        local_708.nstride = local_828.nstride;
        local_708.begin.z = local_828.begin.z;
        local_708.begin.x = local_828.begin.x;
        local_708.begin.y = local_828.begin.y;
        local_708.end.z = local_828.end.z;
        local_708.ncomp = local_828.ncomp;
        local_748.p = local_868.p;
        local_748.jstride = local_868.jstride;
        local_748.kstride = local_868.kstride;
        local_748.nstride = local_868.nstride;
        local_748.begin.z = local_868.begin.z;
        local_748.begin.x = local_868.begin.x;
        local_748.begin.y = local_868.begin.y;
        local_748.end.z = local_868.end.z;
        local_748.ncomp = local_868.ncomp;
        nmc = build_faces(&local_448,&local_7a8,&local_648,&local_688,&local_6c8,&local_bf0,
                          &local_c30,&local_c70,&local_cc8,(Array4<const_double> *)&local_b38,
                          &local_708,&local_748,&local_1e0,&local_220,&local_260,&local_3a0,
                          &local_3e0,&local_420,(Array4<double> *)&test_boxes,(Array4<double> *)&bx,
                          &local_a30,&local_5e8,&local_608,cover_multiple_cuts);
        piVar24 = local_e68;
        if (local_e48 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar24 = (local_e48->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_e68[0];
        }
        BaseFab<amrex::EBCellFlag>::resize
                  ((BaseFab<amrex::EBCellFlag> *)&result,
                   &((local_ec8->super_Level).m_cellflag.m_fabs_v.
                     super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[*piVar24]->
                    super_BaseFab<amrex::EBCellFlag>).domain,1,(Arena *)0x0);
        BaseFab<amrex::EBCellFlag>::elixir<amrex::EBCellFlag,_0>
                  (&cellflagtmp_eli,(BaseFab<amrex::EBCellFlag> *)&result);
        local_b38.p = (EBCellFlag *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
        local_b38.begin.y = 1;
        local_b38.begin.x = result.btype.itype;
        local_b38.jstride = 1 - (long)(int)result.btype.itype;
        local_b38.kstride = 0;
        local_b38.nstride = 0;
        local_b38.begin.z = 1;
        local_b38.end.x = 1;
        local_b38.end.y = 1;
        local_b38.end.z = 1;
        local_b38.ncomp = 0;
        local_708.p = local_3a0.p;
        local_708.jstride = local_3a0.jstride;
        local_708.kstride = local_3a0.kstride;
        local_708.nstride = local_3a0.nstride;
        local_708.begin.z = local_3a0.begin.z;
        local_708.begin.x = local_3a0.begin.x;
        local_708.begin.y = local_3a0.begin.y;
        local_708.end.z = local_3a0.end.z;
        local_708.end.x = local_3a0.end.x;
        local_708.end.y = local_3a0.end.y;
        local_708.ncomp = local_3a0.ncomp;
        local_748.p = local_3e0.p;
        local_748.jstride = local_3e0.jstride;
        local_748.kstride = local_3e0.kstride;
        local_748.nstride = local_3e0.nstride;
        local_748.begin.z = local_3e0.begin.z;
        local_748.begin.x = local_3e0.begin.x;
        local_748.begin.y = local_3e0.begin.y;
        local_748.end.z = local_3e0.end.z;
        local_748.end.x = local_3e0.end.x;
        local_748.end.y = local_3e0.end.y;
        local_748.ncomp = local_3e0.ncomp;
        local_2a0.p = local_420.p;
        local_2a0.jstride = local_420.jstride;
        local_2a0.kstride = local_420.kstride;
        local_2a0.nstride = local_420.nstride;
        local_2a0.begin.z = local_420.begin.z;
        local_2a0.begin.x = local_420.begin.x;
        local_2a0.begin.y = local_420.begin.y;
        local_2a0.end.z = local_420.end.z;
        local_2a0.end.x = local_420.end.x;
        local_2a0.end.y = local_420.end.y;
        local_2a0.ncomp = local_420.ncomp;
        local_2e0.p = (double *)
                      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_2e0.jstride =
             (Long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_2e0.kstride =
             (Long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_2e0.nstride = test_boxes._24_8_;
        local_2e0.begin.z = iVar18;
        local_2e0.ncomp = iVar13;
        local_320.p = (double *)bx.smallend.vect._0_8_;
        local_320.jstride._0_4_ = bx.smallend.vect[2];
        local_320.jstride._4_4_ = bx.bigend.vect[0];
        local_320.kstride._0_4_ = bx.bigend.vect[1];
        local_320.kstride._4_4_ = bx.bigend.vect[2];
        local_320.nstride = stack0xfffffffffffff520;
        local_360.p = local_a30.p;
        local_360.jstride = local_a30.jstride;
        local_360.kstride = local_a30.kstride;
        local_360.nstride = local_a30.nstride;
        local_360.begin.z = local_a30.begin.z;
        local_360.begin.x = local_a30.begin.x;
        local_360.begin.y = local_a30.begin.y;
        local_360.end.z = local_a30.end.z;
        local_360.end.x = local_a30.end.x;
        local_360.end.y = local_a30.end.y;
        local_360.ncomp = local_a30.ncomp;
        local_320.end._0_8_ = (long)local_984 + 1U & 0xffffffff | (long)local_980 + 1 << 0x20;
        local_320.end.z = (int)((long)local_97c + 1);
        local_2e0.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar23 + 1 << 0x20;
        local_2e0.end.z = (int)(lVar21 + 1);
        build_cells(&local_448,&local_7a8,&local_648,&local_688,&local_6c8,&local_1e0,&local_220,
                    &local_260,&local_708,&local_748,&local_2a0,&local_2e0,&local_320,&local_360,
                    &local_70,&local_b0,&local_f0,&local_130,&local_170,&local_b38,&local_cc8,
                    small_volfrac,local_ed0,(bool)(char)local_ebc,cover_multiple_cuts,&nsm,&nmc);
        nsmallcells = nsmallcells + nsm;
        nmulticuts = nmulticuts + nmc;
        Gpu::Elixir::~Elixir(&cellflagtmp_eli);
        MFIter::operator++((MFIter *)&lhs);
      }
      MFIter::~MFIter((MFIter *)&lhs);
      EBCellFlagFab::~EBCellFlagFab((EBCellFlagFab *)&result);
      std::array<amrex::BaseFab<double>,_3UL>::~array((array<amrex::BaseFab<double>,_3UL> *)&pp);
      pp.m_pstack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&nsmallcells;
      pp.m_pstack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = (size_t)&nmulticuts;
      __l._M_len = 2;
      __l._M_array = (iterator)&pp;
      std::vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>::
      vector((vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_> *)
             &local_1a0,__l,(allocator_type *)&test_boxes);
      std::_Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
      ::~_Vector_base(&local_1a0);
      if (nmulticuts == 0 && nsmallcells == 0) break;
      MultiGFab::getLevelSet((MultiFab *)&test_boxes,(MultiGFab *)local_ea0);
      PVar30 = Geometry::periodicity(local_ed0);
      pp.m_pstack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map._0_4_ = PVar30.period.vect[0];
      pp.m_pstack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map._4_4_ = PVar30.period.vect[1];
      pp.m_pstack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = PVar30.period.vect[2];
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                ((FabArray<amrex::FArrayBox> *)&test_boxes,(Periodicity *)&pp,false);
      iVar19 = Verbose();
      if (0 < iVar19) {
        if (nsmallcells != 0) {
          poVar20 = OutStream();
          Print::Print((Print *)&pp,poVar20);
          poVar20 = (ostream *)
                    &pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start;
          std::operator<<(poVar20,"AMReX EB: Iter. ");
          std::ostream::operator<<(poVar20,iVar16 + 1);
          std::operator<<(poVar20," fixed ");
          std::ostream::operator<<(poVar20,nsmallcells);
          std::operator<<(poVar20," small cells");
          std::endl<char,std::char_traits<char>>(poVar20);
          Print::~Print((Print *)&pp);
        }
        if (nmulticuts != 0) {
          poVar20 = OutStream();
          Print::Print((Print *)&pp,poVar20);
          poVar20 = (ostream *)
                    &pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start;
          std::operator<<(poVar20,"AMReX EB: Iter. ");
          std::ostream::operator<<(poVar20,iVar16 + 1);
          std::operator<<(poVar20," fixed ");
          std::ostream::operator<<(poVar20,nmulticuts);
          std::operator<<(poVar20," multicuts");
          std::endl<char,std::char_traits<char>>(poVar20);
          Print::~Print((Print *)&pp);
        }
      }
      MultiFab::~MultiFab((MultiFab *)&test_boxes);
      iVar16 = iVar16 + 1;
    }
    if (maxiter <= iVar16) {
      Assert_host("iter < maxiter",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.H"
                  ,0x1d1,"\"EB: failed to fix small cells\"");
    }
    MFIter::MFIter((MFIter *)&pp,local_ea0,'\0');
    while ((int)pp.m_pstack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last <
           (int)pp.m_pstack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node) {
      iVar16 = (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
      if (pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last != (_Elt_pointer)0x0) {
        iVar16 = *(int *)(((pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last)->_M_dataplus)._M_p +
                         (long)(int)pp.m_pstack.c.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last * 4);
      }
      pGVar5 = (local_ec8->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
               super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
               super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pGVar5[iVar16].m_levelset.dptr;
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(((long)((IntVect *)((long)&pGVar5[iVar16].m_levelset.domain + 0xc))->
                                   vect[0] - (long)pGVar5[iVar16].m_levelset.domain.smallend.vect[0]
                            ) + 1);
      test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((((long)*(int *)((long)&pGVar5[iVar16].m_levelset.domain + 0x10) + 1) -
                     (long)*(int *)((long)&pGVar5[iVar16].m_levelset.domain + 4)) *
                    (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      test_boxes._24_8_ =
           (((long)*(int *)((long)&pGVar5[iVar16].m_levelset.domain + 0x14) + 1) -
           (long)*(int *)((long)&pGVar5[iVar16].m_levelset.domain + 8)) *
           (long)test_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&bx,local_c88,(MFIter *)&pp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&result,local_e98,(MFIter *)&pp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&lhs,local_eb0,(MFIter *)&pp);
      crse_ratio.vect._0_8_ = *(uint **)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x10);
      register0x00000080 =
           ((long)((IntVect *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x24))->vect[0] -
           (long)(((Box *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x18))->smallend).vect[0]) + 1
      ;
      local_cc8.p = *(double **)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x58);
      local_cc8.ncomp = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x7c);
      iVar19 = (((Box *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x60))->smallend).vect[0];
      local_cc8.begin.z = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x68);
      iVar18 = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 100);
      lVar21 = (long)*(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x70) + 1;
      lVar22 = (long)((IntVect *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x6c))->vect[0];
      lVar23 = (long)*(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0x74) + 1;
      local_cc8.jstride = (lVar22 - iVar19) + 1;
      local_cc8.kstride = (lVar21 - iVar18) * local_cc8.jstride;
      local_cc8.nstride = (lVar23 - local_cc8.begin.z) * local_cc8.kstride;
      local_cc8.begin.y = iVar18;
      local_cc8.begin.x = iVar19;
      local_cc8.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
      local_cc8.end.z = (int)lVar23;
      local_7a8.p = *(EBCellFlag **)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xa0);
      local_7a8.ncomp = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xc4);
      iVar19 = (((Box *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xa8))->smallend).vect[0];
      local_7a8.begin.z = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xb0);
      iVar18 = *(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xac);
      lVar21 = (long)*(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xb8) + 1;
      lVar22 = (long)((IntVect *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xb4))->vect[0];
      lVar23 = (long)*(int *)((long)pGVar5[iVar16].m_edgetype._M_elems + 0xbc) + 1;
      local_7a8.jstride = (lVar22 - iVar19) + 1;
      local_7a8.kstride = (lVar21 - iVar18) * local_7a8.jstride;
      local_7a8.nstride = (lVar23 - local_7a8.begin.z) * local_7a8.kstride;
      local_7a8.begin.y = iVar18;
      local_7a8.begin.x = iVar19;
      local_7a8.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
      local_7a8.end.z = (int)lVar23;
      intercept_to_edge_centroid
                ((Array4<double> *)&bx,(Array4<double> *)&result,(Array4<double> *)&lhs,
                 (Array4<const_unsigned_int> *)&crse_ratio,(Array4<const_unsigned_int> *)&local_cc8,
                 (Array4<const_unsigned_int> *)&local_7a8,(Array4<const_double> *)&test_boxes,
                 &local_5e8,&local_608);
      MFIter::operator++((MFIter *)&pp);
    }
    MFIter::~MFIter((MFIter *)&pp);
    MultiGFab::getLevelSet((MultiFab *)&pp,(MultiGFab *)local_ea0);
    pGVar12 = local_ec8;
    FabArray<amrex::FArrayBox>::operator=
              (&(local_ec8->super_Level).m_levelset.super_FabArray<amrex::FArrayBox>,
               (FabArray<amrex::FArrayBox> *)&pp);
    MultiFab::~MultiFab((MultiFab *)&pp);
    (pGVar12->super_Level).m_ok = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mf_info.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&covered_boxes);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&cut_boxes);
  return;
}

Assistant:

void
GShopLevel<G>::define_fine (G const& gshop, const Geometry& geom,
                            int max_grid_size, int ngrow, bool extend_domain_face, int num_crse_opt)
{
    if (amrex::Verbose() > 0 && extend_domain_face == false) {
        amrex::Print() << "AMReX WARNING: extend_domain_face=false is not recommended!\n";
    }

    BL_PROFILE("EB2::GShopLevel()-fine");

#ifdef AMREX_USE_FLOAT
    Real small_volfrac = 1.e-5_rt;
#else
    Real small_volfrac = 1.e-14;
#endif
    bool cover_multiple_cuts = false;
    int maxiter = 32;
    {
        ParmParse pp("eb2");
        pp.queryAdd("small_volfrac", small_volfrac);
        pp.queryAdd("cover_multiple_cuts", cover_multiple_cuts);
        pp.queryAdd("maxiter", maxiter);
    }

    // make sure ngrow is multiple of 16
    m_ngrow = IntVect{static_cast<int>(std::ceil(ngrow/16.)) * 16};

    Box const& domain = geom.Domain();
    Box domain_grown = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            m_ngrow[idim] = 0;
        } else {
            m_ngrow[idim] = std::min(m_ngrow[idim], domain_grown.length(idim));
        }
    }
    domain_grown.grow(m_ngrow);
    Box bounding_box = (extend_domain_face) ? domain : domain_grown;
    bounding_box.surroundingNodes();

    BoxList cut_boxes;
    BoxList covered_boxes;

    const int nprocs = ParallelDescriptor::NProcs();
    const int iproc = ParallelDescriptor::MyProc();

    num_crse_opt = std::max(0,std::min(8,num_crse_opt));
    for (int clev = num_crse_opt; clev >= 0; --clev) {
        IntVect crse_ratio(1 << clev);
        if (domain.coarsenable(crse_ratio)) {
            Box const& crse_bounding_box = amrex::coarsen(bounding_box, crse_ratio);
            Geometry const& crse_geom = amrex::coarsen(geom, crse_ratio);
            BoxList test_boxes;
            if (cut_boxes.isEmpty()) {
                covered_boxes.clear();
                test_boxes = BoxList(crse_geom.Domain());
                test_boxes.maxSize(max_grid_size);
            } else {
                test_boxes.swap(cut_boxes);
                test_boxes.coarsen(crse_ratio);
                test_boxes.maxSize(max_grid_size);
            }

            const Long nboxes = test_boxes.size();
            const auto& boxes = test_boxes.data();
            for (Long i = iproc; i < nboxes; i += nprocs) {
                const Box& vbx = boxes[i];
                const Box& gbx = amrex::surroundingNodes(amrex::grow(vbx,1));
                auto box_type = gshop.getBoxType(gbx&crse_bounding_box,crse_geom,RunOn::Gpu);
                if (box_type == gshop.allcovered) {
                    covered_boxes.push_back(amrex::refine(vbx, crse_ratio));
                } else if (box_type == gshop.mixedcells) {
                    cut_boxes.push_back(amrex::refine(vbx, crse_ratio));
                }
            }

            amrex::AllGatherBoxes(cut_boxes.data());
        }
    }

    amrex::AllGatherBoxes(covered_boxes.data());

    if (m_ngrow != 0) {
        auto grow_at_domain_boundary = [&] (BoxList& bl)
        {
            const IntVect& domlo = domain.smallEnd();
            const IntVect& domhi = domain.bigEnd();
            for (auto& b : bl) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    if (m_ngrow[idim] != 0) {
                        if (b.smallEnd(idim) == domlo[idim]) {
                            b.growLo(idim,m_ngrow[idim]);
                        }
                        if (b.bigEnd(idim) == domhi[idim]) {
                            b.growHi(idim,m_ngrow[idim]);
                        }
                    }
                }
            }
        };
        grow_at_domain_boundary(covered_boxes);
        grow_at_domain_boundary(cut_boxes);
    }

    if ( cut_boxes.isEmpty() &&
        !covered_boxes.isEmpty())
    {
        amrex::Abort("AMReX_EB2_Level.H: Domain is completely covered");
    }

    if (!covered_boxes.isEmpty()) {
        if (num_crse_opt > 2) { // don't want the box too big
            covered_boxes.maxSize(max_grid_size*4);
        }
        m_covered_grids = BoxArray(std::move(covered_boxes));
    }

    if (cut_boxes.isEmpty()) {
        m_grids = BoxArray();
        m_dmap = DistributionMapping();
        m_allregular = true;
        m_ok = true;
        return;
    }

    m_grids = BoxArray(std::move(cut_boxes));
    m_dmap = DistributionMapping(m_grids);

    m_mgf.define(m_grids, m_dmap);
    const int ng = GFab::ng;
    MFInfo mf_info;
    mf_info.SetTag("EB2::Level");
    m_cellflag.define(m_grids, m_dmap, 1, ng, mf_info);
    m_volfrac.define(m_grids, m_dmap, 1, ng, mf_info);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndryarea.define(m_grids, m_dmap, 1, ng, mf_info);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng, mf_info);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng, mf_info);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng, mf_info);
    }

    const auto dx = geom.CellSizeArray();
    const auto problo = geom.ProbLoArray();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (!extend_domain_face || geom.isPeriodic(idim)) {
            bounding_box.grow(idim,GFab::ng);
        }
    }

    RunOn gshop_run_on = (Gpu::inLaunchRegion() && gshop.isGPUable())
        ? RunOn::Gpu : RunOn::Cpu;

    bool hybrid = Gpu::inLaunchRegion() && (gshop_run_on == RunOn::Cpu);

    int iter = 0;
    for (; iter < maxiter; ++iter)
    {
        int nsmallcells = 0;
        int nmulticuts = 0;
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion()) reduction(+:nsmallcells,nmulticuts)
#endif
        {
#if (AMREX_SPACEDIM == 3)
            Array<BaseFab<Real>, AMREX_SPACEDIM> M2;
            EBCellFlagFab cellflagtmp;
#endif
            for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
            {
                auto& gfab = m_mgf[mfi];
                const Box& vbx = gfab.validbox();

                auto& levelset = gfab.getLevelSet();
                if (iter == 0) {
                    gshop.fillFab(levelset, geom, gshop_run_on, bounding_box);
                    if (hybrid) {
                        levelset.prefetchToDevice();
                    }
                }

                auto& cellflag = m_cellflag[mfi];

                gfab.buildTypes(cellflag);

                Array4<Real const> const& clst = levelset.const_array();
                Array4<Real      > const&  lst = levelset.array();
                Array4<EBCellFlag> const& cfg = m_cellflag.array(mfi);
                Array4<Real> const& vfr = m_volfrac.array(mfi);
                Array4<Real> const& ctr = m_centroid.array(mfi);
                Array4<Real> const& bar = m_bndryarea.array(mfi);
                Array4<Real> const& bct = m_bndrycent.array(mfi);
                Array4<Real> const& bnm = m_bndrynorm.array(mfi);
                AMREX_D_TERM(Array4<Real> const& apx = m_areafrac[0].array(mfi);,
                             Array4<Real> const& apy = m_areafrac[1].array(mfi);,
                             Array4<Real> const& apz = m_areafrac[2].array(mfi););
                AMREX_D_TERM(Array4<Real> const& fcx = m_facecent[0].array(mfi);,
                             Array4<Real> const& fcy = m_facecent[1].array(mfi);,
                             Array4<Real> const& fcz = m_facecent[2].array(mfi););

                auto& facetype = gfab.getFaceType();
                AMREX_D_TERM(Array4<Type_t> const& ftx = facetype[0].array();,
                             Array4<Type_t> const& fty = facetype[1].array();,
                             Array4<Type_t> const& ftz = facetype[2].array(););

                int nmc = 0;
                int nsm = 0;

#if (AMREX_SPACEDIM == 3)
                auto& edgetype = gfab.getEdgeType();
                Array4<Type_t const> const& xdg = edgetype[0].const_array();
                Array4<Type_t const> const& ydg = edgetype[1].const_array();
                Array4<Type_t const> const& zdg = edgetype[2].const_array();

                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);
                Array4<Real> const& zip = m_edgecent[2].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    gshop.getIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst,
                                       geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst, geom);
                }

                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    const Box& b = facetype[idim].box();
                    M2[idim].resize(b,3);
                }
                Array4<Real> const& xm2 = M2[0].array();
                Array4<Real> const& ym2 = M2[1].array();
                Array4<Real> const& zm2 = M2[2].array();

                nmc = build_faces(vbx, cfg, ftx, fty, ftz, xdg, ydg, zdg, lst,
                                  xip, yip, zip, apx, apy, apz, fcx, fcy, fcz,
                                  xm2, ym2, zm2, dx, problo, cover_multiple_cuts);

                cellflagtmp.resize(m_cellflag[mfi].box());
                Elixir cellflagtmp_eli = cellflagtmp.elixir();
                Array4<EBCellFlag> const& cfgtmp = cellflagtmp.array();

                build_cells(vbx, cfg, ftx, fty, ftz, apx, apy, apz,
                            fcx, fcy, fcz, xm2, ym2, zm2, vfr, ctr,
                            bar, bct, bnm, cfgtmp, lst,
                            small_volfrac, geom, extend_domain_face, cover_multiple_cuts,
                            nsm, nmc);

                // Becasue it is used in a synchronous reduction kernel in
                // build_cells, we do not need to worry about M2's lifetime.
                // But we still need to use Elixir to extend the life of
                // cellflagtmp.

#elif (AMREX_SPACEDIM == 2)
                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    //                         yes, factype[1] and then [0]
                    gshop.getIntercept({xip,yip},
                                       {facetype[1].const_array(), facetype[0].const_array()},
                                       clst, geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip},
                                          {facetype[1].const_array(), facetype[0].const_array()},
                                          clst, geom);
                }

                nmc = build_faces(vbx, cfg, ftx, fty, clst, xip, yip, apx, apy, fcx, fcy,
                                  dx, problo, cover_multiple_cuts);

                build_cells(vbx, cfg, ftx, fty, apx, apy, vfr, ctr,
                            bar, bct, bnm, lst, small_volfrac, geom, extend_domain_face,
                            nsm, nmc);
#endif
                nsmallcells += nsm;
                nmulticuts  += nmc;
            }
        }

        ParallelAllReduce::Sum<int>({nsmallcells,nmulticuts}, ParallelContext::CommunicatorSub());
        if (nsmallcells == 0 && nmulticuts == 0) {
            break;
        } else {
            auto ls = m_mgf.getLevelSet();
            // This is an alias MulitFab, therefore FillBoundary on it is fine.
            ls.FillBoundary(geom.periodicity());
            if (amrex::Verbose() > 0) {
                if (nsmallcells) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nsmallcells
                                   << " small cells" << std::endl;
                }
                if (nmulticuts) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nmulticuts
                                   << " multicuts" << std::endl;
                }
            }
        }
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(iter < maxiter, "EB: failed to fix small cells");

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
    {
        auto& gfab = m_mgf[mfi];
        auto const& levelset = gfab.getLevelSet();
        Array4<Real const> const& clst = levelset.const_array();

        AMREX_D_TERM(Array4<Real> const& xip = m_edgecent[0].array(mfi);,
                     Array4<Real> const& yip = m_edgecent[1].array(mfi);,
                     Array4<Real> const& zip = m_edgecent[2].array(mfi);)
#if (AMREX_SPACEDIM == 3)
        auto const& edgetype = gfab.getEdgeType();
        Array4<Type_t const> const& xdg = edgetype[0].const_array();
        Array4<Type_t const> const& ydg = edgetype[1].const_array();
        Array4<Type_t const> const& zdg = edgetype[2].const_array();

        intercept_to_edge_centroid(xip, yip, zip, xdg, ydg, zdg, clst, dx, problo);

#elif (AMREX_SPACEDIM == 2)
        auto& facetype = gfab.getFaceType();
        Array4<Type_t const> const& ftx = facetype[0].const_array();
        Array4<Type_t const> const& fty = facetype[1].const_array();
        //                                  fty then ftx
        intercept_to_edge_centroid(xip, yip, fty, ftx, clst, dx, problo);
#endif
    }

    m_levelset = m_mgf.getLevelSet();

    m_ok = true;
}